

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateNoCompression(ucvector *out,uchar *data,size_t datasize)

{
  uint uVar1;
  ulong uVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined1 uVar3;
  size_t pos;
  uchar firstbyte;
  uint NLEN;
  uint LEN;
  uint BTYPE;
  uint BFINAL;
  size_t datapos;
  size_t numdeflateblocks;
  size_t i;
  size_t size;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  uint local_44;
  long local_38;
  ulong local_28;
  
  uVar2 = (in_RDX + 0xfffeU) / 0xffff;
  local_38 = 0;
  local_28 = 0;
  while( true ) {
    if (local_28 == uVar2) {
      return 0;
    }
    size = in_RDI[1];
    uVar3 = local_28 == uVar2 - 1;
    local_44 = 0xffff;
    if ((ulong)(in_RDX - local_38) < 0xffff) {
      local_44 = (int)in_RDX - (int)local_38;
    }
    uVar1 = ucvector_resize((ucvector *)
                            CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),size);
    if (uVar1 == 0) break;
    *(undefined1 *)(*in_RDI + size) = uVar3;
    *(char *)(*in_RDI + 1 + size) = (char)local_44;
    *(char *)(*in_RDI + 2 + size) = (char)(local_44 >> 8);
    *(char *)(*in_RDI + 3 + size) = (char)(0xffff - local_44);
    *(char *)(*in_RDI + 4 + size) = (char)(0xffff - local_44 >> 8);
    lodepng_memcpy((void *)(*in_RDI + size + 5),(void *)(in_RSI + local_38),(ulong)local_44);
    local_38 = (ulong)local_44 + local_38;
    local_28 = local_28 + 1;
    in_stack_ffffffffffffffb7 = uVar3;
  }
  return 0x53;
}

Assistant:

static unsigned deflateNoCompression(ucvector* out, const unsigned char* data, size_t datasize) {
  /*non compressed deflate block data: 1 bit BFINAL,2 bits BTYPE,(5 bits): it jumps to start of next byte,
  2 bytes LEN, 2 bytes NLEN, LEN bytes literal DATA*/

  size_t i, numdeflateblocks = (datasize + 65534u) / 65535u;
  size_t datapos = 0;
  for(i = 0; i != numdeflateblocks; ++i) {
    unsigned BFINAL, BTYPE, LEN, NLEN;
    unsigned char firstbyte;
    size_t pos = out->size;

    BFINAL = (i == numdeflateblocks - 1);
    BTYPE = 0;

    LEN = 65535;
    if(datasize - datapos < 65535u) LEN = (unsigned)datasize - (unsigned)datapos;
    NLEN = 65535 - LEN;

    if(!ucvector_resize(out, out->size + LEN + 5)) return 83; /*alloc fail*/

    firstbyte = (unsigned char)(BFINAL + ((BTYPE & 1u) << 1u) + ((BTYPE & 2u) << 1u));
    out->data[pos + 0] = firstbyte;
    out->data[pos + 1] = (unsigned char)(LEN & 255);
    out->data[pos + 2] = (unsigned char)(LEN >> 8u);
    out->data[pos + 3] = (unsigned char)(NLEN & 255);
    out->data[pos + 4] = (unsigned char)(NLEN >> 8u);
    lodepng_memcpy(out->data + pos + 5, data + datapos, LEN);
    datapos += LEN;
  }

  return 0;
}